

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::update_piece_priorities
          (torrent *this,vector<download_priority_t,_file_index_t> *file_prios)

{
  byte bVar1;
  element_type *peVar2;
  pointer psVar3;
  bool bVar4;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar5;
  int64_t iVar6;
  long lVar7;
  pointer psVar8;
  byte bVar9;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  file_index_t index;
  long lVar10;
  vector<download_priority_t,_piece_index_t> pieces;
  int local_58;
  int local_54;
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  local_50;
  vector<download_priority_t,_file_index_t> *local_38;
  
  peVar2 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2->m_files).m_num_pieces != 0) {
    local_38 = file_prios;
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::vector(&local_50,(long)(peVar2->m_files).m_num_pieces,(value_type *)&dont_download,
             (allocator_type *)&local_58);
    peVar2 = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar5 = file_storage::file_range(&peVar2->m_files);
    if (iVar5._begin.m_val.m_val != iVar5._end.m_val.m_val) {
      lVar10 = (long)iVar5._begin.m_val.m_val;
      bVar4 = false;
      do {
        index.m_val = (int)lVar10;
        iVar6 = file_storage::file_size
                          (&((this->super_torrent_hot_members).m_torrent_file.
                             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_files,index);
        if (iVar6 != 0) {
          bVar4 = file_storage::pad_file_at(&peVar2->m_files,index);
          psVar8 = (pointer)&dont_download;
          if ((!bVar4) &&
             (psVar3 = (local_38->
                       super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       ).
                       super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_start, psVar8 = psVar3 + lVar10,
             *(int *)&(local_38->
                      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      ).
                      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (int)psVar3 <= lVar10)) {
            psVar8 = (pointer)&default_priority;
          }
          bVar1 = psVar8->m_val;
          bVar4 = true;
          if (bVar1 != 0) {
            file_piece_range_inclusive((aux *)&local_58,&peVar2->m_files,index);
            lVar7 = (long)local_54;
            if (local_54 < local_58) {
              do {
                bVar9 = local_50.
                        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar7].m_val;
                if (local_50.
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar7].m_val <= bVar1) {
                  bVar9 = bVar1;
                }
                local_50.
                super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar7].m_val = bVar9;
                lVar7 = lVar7 + 1;
              } while (lVar7 < local_58);
            }
          }
        }
        lVar10 = lVar10 + 1;
      } while ((int)lVar10 != iVar5._end.m_val.m_val);
      if (bVar4) {
        prioritize_pieces(this,(vector<download_priority_t,_piece_index_t> *)&local_50);
      }
    }
    if (local_50.
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void torrent::update_piece_priorities(
		aux::vector<download_priority_t, file_index_t> const& file_prios)
	{
		INVARIANT_CHECK;

		if (m_torrent_file->num_pieces() == 0) return;

		bool need_update = false;
		// initialize the piece priorities to 0, then only allow
		// setting higher priorities
		aux::vector<download_priority_t, piece_index_t> pieces(aux::numeric_cast<std::size_t>(
			m_torrent_file->num_pieces()), dont_download);
		file_storage const& fs = m_torrent_file->files();
		for (auto const i : fs.file_range())
		{
			std::int64_t const size = m_torrent_file->files().file_size(i);
			if (size == 0) continue;

			// pad files always have priority 0
			download_priority_t const file_prio
				= fs.pad_file_at(i) ? dont_download
				: i >= file_prios.end_index() ? default_priority
				: file_prios[i];

			if (file_prio == dont_download)
			{
				// the pieces already start out as priority 0, no need to update
				// the pieces vector in this case
				need_update = true;
				continue;
			}

			// mark all pieces of the file with this file's priority
			// but only if the priority is higher than the pieces
			// already set (to avoid problems with overlapping pieces)
			auto const [start, end] = file_piece_range_inclusive(fs, i);

			// if one piece spans several files, we might
			// come here several times with the same start_piece, end_piece
			for (piece_index_t p = start; p < end; ++p)
				pieces[p] = std::max(pieces[p], file_prio);

			need_update = true;
		}
		if (need_update) prioritize_pieces(pieces);
	}